

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::HandleBadFullItem
          (cmComputeLinkInformation *this,string *item,string *file)

{
  cmake *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmState *pcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  PolicyID id_00;
  undefined1 local_418 [16];
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [8];
  ostringstream e;
  undefined1 local_250 [16];
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  ostringstream w;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string wid;
  const_iterator local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  iterator i;
  string *file_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  i._M_current = file;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Depends);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->Depends);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_30,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_38,item);
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->Depends);
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_40);
  if (bVar2) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_48,&local_28);
    wid.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::erase(&this->Depends,local_48);
  }
  AddUserItem(this,i._M_current,false);
  cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,item);
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  switch(PVar3) {
  case WARN:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"CMP0008-WARNING-GIVEN-",&local_71);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::operator+=((string *)local_70,(string *)item);
    pcVar4 = cmake::GetState(this->CMakeInstance);
    bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,(string *)local_70);
    if (!bVar2) {
      pcVar4 = cmake::GetState(this->CMakeInstance);
      cmState::SetGlobalProperty(pcVar4,(string *)local_70,"1");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_220,(cmPolicies *)0x8,id);
      poVar5 = std::operator<<((ostream *)local_200,(string *)&local_220);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"Target \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\" links to item\n");
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)item);
      poVar5 = std::operator<<(poVar5,"\n");
      std::operator<<(poVar5,"which is a full-path but not a valid library file name.");
      std::__cxx11::string::~string((string *)&local_220);
      pcVar1 = this->CMakeInstance;
      std::__cxx11::ostringstream::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_250);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)(local_250 + 0x10),
                          (cmListFileBacktrace *)local_250);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_250);
      std::__cxx11::string::~string((string *)(local_250 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    }
    std::__cxx11::string::~string((string *)local_70);
  case OLD:
    break;
  case NEW:
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_3e8,(cmPolicies *)0x8,id_00);
    poVar5 = std::operator<<((ostream *)local_3c8,(string *)&local_3e8);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"Target \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5,"\" links to item\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)item);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"which is a full-path but not a valid library file name.");
    std::__cxx11::string::~string((string *)&local_3e8);
    pcVar1 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_418);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_418 + 0x10),
                        (cmListFileBacktrace *)local_418);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_418);
    std::__cxx11::string::~string((string *)(local_418 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::HandleBadFullItem(std::string const& item,
                                                 std::string const& file)
{
  // Do not depend on things that do not exist.
  std::vector<std::string>::iterator i =
    std::find(this->Depends.begin(), this->Depends.end(), item);
  if (i != this->Depends.end()) {
    this->Depends.erase(i);
  }

  // Tell the linker to search for the item and provide the proper
  // path for it.  Do not contribute to any CMP0003 warning (do not
  // put in OldLinkDirItems or OldUserFlagItems).
  this->AddUserItem(file, false);
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  // Produce any needed message.
  switch (this->Target->GetPolicyStatusCMP0008()) {
    case cmPolicies::WARN: {
      // Print the warning at most once for this item.
      std::string wid = "CMP0008-WARNING-GIVEN-";
      wid += item;
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(wid)) {
        this->CMakeInstance->GetState()->SetGlobalProperty(wid, "1");
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0008) << "\n"
          << "Target \"" << this->Target->GetName() << "\" links to item\n"
          << "  " << item << "\n"
          << "which is a full-path but not a valid library file name.";
        /* clang-format on */
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    }
    case cmPolicies::OLD:
      // OLD behavior does not warn.
      break;
    case cmPolicies::NEW:
      // NEW behavior will not get here.
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0008) << "\n"
          << "Target \"" << this->Target->GetName() << "\" links to item\n"
          << "  " << item << "\n"
          << "which is a full-path but not a valid library file name.";
      /* clang-format on */
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
    } break;
  }
}